

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O2

void __thiscall
reflect::TypeDescriptor_StdVector::dump(TypeDescriptor_StdVector *this,void *obj,int indentLevel)

{
  TypeDescriptor *pTVar1;
  size_t sVar2;
  ostream *poVar3;
  void *pvVar4;
  size_t index;
  size_t sVar5;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  ulong local_40;
  void *local_38;
  
  local_38 = obj;
  sVar2 = (*this->getSize)(obj);
  (*(this->super_TypeDescriptor)._vptr_TypeDescriptor[2])((string *)local_60,this);
  std::operator<<((ostream *)&std::cout,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if (sVar2 == 0) {
    std::operator<<((ostream *)&std::cout,"{}");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"{");
    std::endl<char,std::char_traits<char>>(poVar3);
    local_40 = (ulong)(uint)indentLevel;
    for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct((ulong)local_60,(char)indentLevel * '\x04' + '\x04');
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_60);
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"] ");
      std::__cxx11::string::~string((string *)local_60);
      pTVar1 = this->itemType;
      pvVar4 = (*this->getItem)(local_38,sVar5);
      (*pTVar1->_vptr_TypeDescriptor[3])(pTVar1,pvVar4,(ulong)(indentLevel + 1));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct((ulong)local_60,(char)((int)local_40 << 2));
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_60);
    std::operator<<(poVar3,"}");
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        size_t numItems = getSize(obj);
        std::cout << getFullName();
        if (numItems == 0) {
            std::cout << "{}";
        } else {
            std::cout << "{" << std::endl;
            for (size_t index = 0; index < numItems; index++) {
                std::cout << std::string(4 * (indentLevel + 1), ' ') << "[" << index << "] ";
                itemType->dump(getItem(obj, index), indentLevel + 1);
                std::cout << std::endl;
            }
            std::cout << std::string(4 * indentLevel, ' ') << "}";
        }
    }